

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
               (AutoFile *os,
               map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
               *m)

{
  long lVar1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<AutoFile>(os,(m->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var2 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(m->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    Serialize<AutoFile,uint256_const,long>(os,(pair<const_uint256,_long> *)(p_Var2 + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::map<K, T, Pred, A>& m)
{
    WriteCompactSize(os, m.size());
    for (const auto& entry : m)
        Serialize(os, entry);
}